

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O2

void Ivy_ManCollectCone_rec(Ivy_Obj_t *pObj,Vec_Ptr_t *vCone)

{
  void **ppvVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((*(uint *)&pObj->field_0x8 & 0x10) == 0) {
    uVar2 = *(uint *)&pObj->field_0x8 & 0xf;
    if (uVar2 == 7) {
      Ivy_ManCollectCone_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vCone);
LAB_0062233d:
      Vec_PtrPush(vCone,pObj);
      return;
    }
    if (uVar2 - 7 < 0xfffffffe) {
      __assert_fail("Ivy_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/ivy/ivyDfs.c"
                    ,0xb2,"void Ivy_ManCollectCone_rec(Ivy_Obj_t *, Vec_Ptr_t *)");
    }
    Ivy_ManCollectCone_rec((Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vCone);
    Ivy_ManCollectCone_rec((Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vCone);
    uVar4 = 0;
    uVar3 = (ulong)(uint)vCone->nSize;
    if (vCone->nSize < 1) {
      uVar3 = uVar4;
    }
    do {
      if (uVar3 == uVar4) goto LAB_0062233d;
      ppvVar1 = vCone->pArray + uVar4;
      uVar4 = uVar4 + 1;
    } while ((Ivy_Obj_t *)*ppvVar1 != pObj);
  }
  return;
}

Assistant:

void Ivy_ManCollectCone_rec( Ivy_Obj_t * pObj, Vec_Ptr_t * vCone )
{
    if ( pObj->fMarkA )
        return;
    if ( Ivy_ObjIsBuf(pObj) )
    {
        Ivy_ManCollectCone_rec( Ivy_ObjFanin0(pObj), vCone );
        Vec_PtrPush( vCone, pObj );
        return;
    }
    assert( Ivy_ObjIsNode(pObj) );
    Ivy_ManCollectCone_rec( Ivy_ObjFanin0(pObj), vCone );
    Ivy_ManCollectCone_rec( Ivy_ObjFanin1(pObj), vCone );
    Vec_PtrPushUnique( vCone, pObj );
}